

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDirEntryWrapper.cpp
# Opt level: O0

bufsize_t __thiscall
DataDirEntryWrapper::getDirEntrySize(DataDirEntryWrapper *this,bool trimToExeSize)

{
  PEFile *pPVar1;
  Executable *pEVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  IMAGE_DATA_DIRECTORY *pIVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DataDirEntryWrapper *local_88;
  ulong local_80;
  DataDirWrapper *local_78;
  bufsize_t remainingSize;
  bufsize_t fullSize;
  offset_t dirRaw;
  offset_t dirRva;
  bufsize_t dirSize;
  IMAGE_DATA_DIRECTORY *d;
  size_t recordsCount;
  DataDirWrapper *dDir;
  bool trimToExeSize_local;
  DataDirEntryWrapper *this_local;
  
  pPVar1 = (this->super_PENodeWrapper).m_PE;
  iVar3 = (*(pPVar1->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer[2])
                    (&(pPVar1->super_MappedExe).super_ExeWrappersContainer,4);
  if (CONCAT44(extraout_var,iVar3) == 0) {
    local_78 = (DataDirWrapper *)0x0;
  }
  else {
    local_78 = (DataDirWrapper *)
               __dynamic_cast(CONCAT44(extraout_var,iVar3),&ExeElementWrapper::typeinfo,
                              &DataDirWrapper::typeinfo,0);
  }
  if (local_78 == (DataDirWrapper *)0x0) {
    local_80 = 0;
  }
  else {
    local_80 = DataDirWrapper::getDirsCount(local_78);
  }
  if ((ulong)(long)this->entryType < local_80) {
    pIVar5 = getDataDirectory(this);
    if (pIVar5 == (IMAGE_DATA_DIRECTORY *)0x0) {
      this_local = (DataDirEntryWrapper *)0x0;
    }
    else {
      this_local = (DataDirEntryWrapper *)(ulong)pIVar5[this->entryType].Size;
      if (trimToExeSize) {
        if ((this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.m_Exe ==
            (Executable *)0x0) {
          this_local = (DataDirEntryWrapper *)0x0;
        }
        else {
          pEVar2 = (this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.m_Exe;
          iVar3 = (*(pEVar2->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x1a])
                            (pEVar2,(ulong)pIVar5[this->entryType].VirtualAddress);
          if (CONCAT44(extraout_var_00,iVar3) == -1) {
            this_local = (DataDirEntryWrapper *)0x0;
          }
          else {
            iVar4 = (*(((this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                       m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[2])();
            local_88 = (DataDirEntryWrapper *)
                       (CONCAT44(extraout_var_01,iVar4) - CONCAT44(extraout_var_00,iVar3));
            if (this_local < local_88) {
              local_88 = this_local;
            }
            this_local = local_88;
          }
        }
      }
    }
  }
  else {
    this_local = (DataDirEntryWrapper *)0x0;
  }
  return (bufsize_t)this_local;
}

Assistant:

bufsize_t DataDirEntryWrapper::getDirEntrySize(bool trimToExeSize)
{
    DataDirWrapper *dDir = dynamic_cast<DataDirWrapper*>(m_PE->getWrapper(PEFile::WR_DATADIR));
    const size_t recordsCount = dDir ? dDir->getDirsCount() : 0;
    if (this->entryType >= recordsCount) return 0;
    
    IMAGE_DATA_DIRECTORY *d = getDataDirectory();
    if (!d) return 0;
    
    bufsize_t dirSize = static_cast<bufsize_t>(d[this->entryType].Size);
    if (!trimToExeSize) {
        return dirSize;
    }
    
    if (!this->m_Exe) return 0; // should never happen
    
    offset_t dirRva = d[this->entryType].VirtualAddress;
    offset_t dirRaw = this->m_Exe->rvaToRaw(dirRva);
    if (dirRaw == INVALID_ADDR) {
        return 0;
    }
    bufsize_t fullSize = this->m_Exe->getContentSize();
    bufsize_t remainingSize = bufsize_t(fullSize - dirRaw);
    
    return (dirSize < remainingSize) ? dirSize : remainingSize;
}